

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
* __thiscall
kj::_::
NullableValue<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
::operator=(NullableValue<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
            *this,NullableValue<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
                  *other)

{
  Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>
  *params;
  NullableValue<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  *other_local;
  NullableValue<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
  *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Own<capnp::PipelineHook>>>
                (&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Own<capnp::PipelineHook>>>
                         (&(other->field_1).value);
      ctor<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Own<capnp::PipelineHook>>,kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>,kj::Own<capnp::PipelineHook>>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }